

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O0

int open_plugin(char *raw,char *display,input_ops **ops,input_handle **ih)

{
  int iVar1;
  input_ops *piVar2;
  input_handle *piVar3;
  int result;
  input_handle **ih_local;
  input_ops **ops_local;
  char *display_local;
  char *raw_local;
  
  piVar2 = input_get_ops(raw);
  *ops = piVar2;
  if (*ops == (input_ops *)0x0) {
    if (verbose != 0) {
      fprintf(_stderr,"No plugin found for file \'%s\'\n",display);
    }
    raw_local._4_4_ = 1;
  }
  else {
    piVar3 = (*(*ops)->handle_init)();
    *ih = piVar3;
    iVar1 = (*(*ops)->open_file)(*ih,raw);
    if (iVar1 == 0) {
      raw_local._4_4_ = 0;
    }
    else {
      if (verbose != 0) {
        fprintf(_stderr,"Error opening file \'%s\'\n",display);
      }
      raw_local._4_4_ = 1;
    }
  }
  return raw_local._4_4_;
}

Assistant:

int
open_plugin(char const *raw, char const *display, struct input_ops **ops,
    struct input_handle **ih)
{
	int result;

	*ops = input_get_ops(raw);
	if (!(*ops)) {
		if (verbose) {
			fprintf(stderr, "No plugin found for file '%s'\n",
			    display);
		}
		return 1;
	}
	*ih = (*ops)->handle_init();

	result = (*ops)->open_file(*ih, raw);
	if (result) {
		if (verbose) {
			fprintf(stderr, "Error opening file '%s'\n", display);
		}
		return 1;
	}
	return 0;
}